

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_regex.cpp
# Opt level: O1

bool duckdb_re2::RegexSearchInternal
               (char *input_data,size_t input_size,Match *match,RE2 *regex,Anchor anchor,
               size_t start,size_t end)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pSVar2;
  bool bVar3;
  size_type __new_size;
  pointer pSVar4;
  vector<duckdb_re2::StringPiece,_true> target_groups;
  GroupMatch group_match;
  vector<duckdb_re2::StringPiece,_std::allocator<duckdb_re2::StringPiece>_> local_a8;
  char *local_88;
  vector<duckdb_re2::GroupMatch,std::allocator<duckdb_re2::GroupMatch>> *local_80;
  GroupMatch local_78;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_a8.super__Vector_base<duckdb_re2::StringPiece,_std::allocator<duckdb_re2::StringPiece>_>.
  _M_impl.super__Vector_impl_data._M_start = (StringPiece *)0x0;
  local_a8.super__Vector_base<duckdb_re2::StringPiece,_std::allocator<duckdb_re2::StringPiece>_>.
  _M_impl.super__Vector_impl_data._M_finish = (StringPiece *)0x0;
  local_a8.super__Vector_base<duckdb_re2::StringPiece,_std::allocator<duckdb_re2::StringPiece>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __new_size = (long)regex->num_captures_ + 1;
  duckdb::std::vector<duckdb_re2::StringPiece,_std::allocator<duckdb_re2::StringPiece>_>::resize
            (&local_a8,__new_size);
  local_80 = (vector<duckdb_re2::GroupMatch,std::allocator<duckdb_re2::GroupMatch>> *)match;
  duckdb::std::vector<duckdb_re2::GroupMatch,_std::allocator<duckdb_re2::GroupMatch>_>::clear
            ((vector<duckdb_re2::GroupMatch,_std::allocator<duckdb_re2::GroupMatch>_> *)match);
  local_88 = input_data;
  local_78.text._M_dataplus._M_p = input_data;
  local_78.text._M_string_length = input_size;
  bVar3 = RE2::Match(regex,(StringPiece *)&local_78,start,end,anchor,
                     local_a8.
                     super__Vector_base<duckdb_re2::StringPiece,_std::allocator<duckdb_re2::StringPiece>_>
                     ._M_impl.super__Vector_impl_data._M_start,(int)__new_size);
  pSVar2 = local_a8.
           super__Vector_base<duckdb_re2::StringPiece,_std::allocator<duckdb_re2::StringPiece>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (bVar3) {
    if (local_a8.
        super__Vector_base<duckdb_re2::StringPiece,_std::allocator<duckdb_re2::StringPiece>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_a8.
        super__Vector_base<duckdb_re2::StringPiece,_std::allocator<duckdb_re2::StringPiece>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      paVar1 = &local_78.text.field_2;
      pSVar4 = local_a8.
               super__Vector_base<duckdb_re2::StringPiece,_std::allocator<duckdb_re2::StringPiece>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_78.text._M_string_length = 0;
        local_78.text.field_2._M_local_buf[0] = '\0';
        local_78.text._M_dataplus._M_p = (pointer)paVar1;
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,pSVar4->data_,pSVar4->data_ + pSVar4->size_);
        std::__cxx11::string::operator=((string *)&local_78,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        if (pSVar4->data_ == (const_pointer)0x0) {
          local_78.position = 0;
        }
        else {
          local_78.position =
               duckdb::NumericCastImpl<unsigned_int,_long,_false>::Convert
                         ((long)pSVar4->data_ - (long)local_88);
        }
        std::vector<duckdb_re2::GroupMatch,std::allocator<duckdb_re2::GroupMatch>>::
        emplace_back<duckdb_re2::GroupMatch&>(local_80,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78.text._M_dataplus._M_p != paVar1) {
          operator_delete(local_78.text._M_dataplus._M_p);
        }
        pSVar4 = pSVar4 + 1;
      } while (pSVar4 != pSVar2);
    }
  }
  if (local_a8.super__Vector_base<duckdb_re2::StringPiece,_std::allocator<duckdb_re2::StringPiece>_>
      ._M_impl.super__Vector_impl_data._M_start != (StringPiece *)0x0) {
    operator_delete(local_a8.
                    super__Vector_base<duckdb_re2::StringPiece,_std::allocator<duckdb_re2::StringPiece>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool RegexSearchInternal(const char *input_data, size_t input_size, Match &match, const RE2 &regex, RE2::Anchor anchor,
                         size_t start, size_t end) {
	duckdb::vector<StringPiece> target_groups;
	auto group_count = duckdb::UnsafeNumericCast<size_t>(regex.NumberOfCapturingGroups() + 1);
	target_groups.resize(group_count);
	match.groups.clear();
	if (!regex.Match(StringPiece(input_data, input_size), start, end, anchor, target_groups.data(),
	                 duckdb::UnsafeNumericCast<int>(group_count))) {
		return false;
	}
	for (auto &group : target_groups) {
		GroupMatch group_match;
		group_match.text = group.ToString();
		group_match.position = group.data() != nullptr ? duckdb::NumericCast<uint32_t>(group.data() - input_data) : 0;
		match.groups.emplace_back(group_match);
	}
	return true;
}